

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,wchar_t **it)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  uint uVar4;
  wchar_t *pwVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  char acStack_d [13];
  
  uVar4 = *(uint *)this;
  iVar1 = *(int *)(this + 4);
  pcVar3 = acStack_d + iVar1;
  uVar7 = uVar4;
  if (99 < uVar4) {
    do {
      uVar7 = uVar4 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar4 % 100) * 2);
      pcVar3 = pcVar3 + -2;
      bVar2 = 9999 < uVar4;
      uVar4 = uVar4 / 100;
    } while (bVar2);
  }
  pwVar5 = *it;
  if (uVar7 < 10) {
    bVar6 = (byte)uVar7 | 0x30;
    lVar8 = -1;
  }
  else {
    pcVar3[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar7 * 2 & 0xffffffff) + 1];
    bVar6 = internal::basic_data<void>::DIGITS[(ulong)uVar7 * 2];
    lVar8 = -2;
  }
  pcVar3[lVar8] = bVar6;
  if (0 < iVar1) {
    lVar8 = 0;
    do {
      *pwVar5 = (int)acStack_d[lVar8];
      pwVar5 = pwVar5 + 1;
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
  }
  *it = pwVar5;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }